

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_unk8c(envy_bios *bios)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  envy_bios_power_unk8c_entry *peVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  uVar6 = (bios->power).unk8c.offset;
  iVar9 = -0x16;
  if ((ulong)uVar6 != 0) {
    if (uVar6 < bios->length) {
      (bios->power).unk8c.version = bios->data[uVar6];
    }
    else {
      (bios->power).unk8c.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->power).unk8c.version == '\x10') {
      uVar6 = (bios->power).unk8c.offset + 1;
      if (uVar6 < bios->length) {
        (bios->power).unk8c.hlen = bios->data[uVar6];
        iVar9 = 0;
      }
      else {
        (bios->power).unk8c.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar9 = -0xe;
      }
      uVar6 = (bios->power).unk8c.offset + 2;
      if (uVar6 < bios->length) {
        (bios->power).unk8c.rlen = bios->data[uVar6];
        iVar7 = 0;
      }
      else {
        (bios->power).unk8c.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar7 = -0xe;
      }
      uVar6 = (bios->power).unk8c.offset + 3;
      if (uVar6 < bios->length) {
        (bios->power).unk8c.entriesnum = bios->data[uVar6];
        iVar3 = 0;
      }
      else {
        (bios->power).unk8c.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar3 = -0xe;
      }
      (bios->power).unk8c.valid = (iVar7 == 0 && iVar9 == 0) && iVar3 == 0;
      bVar1 = (bios->power).unk8c.entriesnum;
      peVar4 = (envy_bios_power_unk8c_entry *)malloc((ulong)((uint)bVar1 * 4));
      (bios->power).unk8c.entries = peVar4;
      if (bVar1 == 0) {
        iVar9 = 0;
      }
      else {
        uVar5 = (uint)(bios->power).unk8c.hlen + (bios->power).unk8c.offset;
        bVar2 = (bios->power).unk8c.rlen;
        iVar9 = 0;
        uVar8 = 0;
        do {
          peVar4[uVar8].offset = uVar5;
          uVar8 = uVar8 + 1;
          uVar5 = uVar5 + bVar2;
        } while (bVar1 != uVar8);
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER GC6 table version 0x%x\n");
    }
  }
  return iVar9;
}

Assistant:

int envy_bios_parse_power_unk8c(struct envy_bios *bios) {
	struct envy_bios_power_unk8c *unk8c = &bios->power.unk8c;
	int i, err = 0;

	if (!unk8c->offset)
		return -EINVAL;

	bios_u8(bios, unk8c->offset + 0x0, &unk8c->version);
	switch(unk8c->version) {
	case 0x10:
		err |= bios_u8(bios, unk8c->offset + 0x1, &unk8c->hlen);
		err |= bios_u8(bios, unk8c->offset + 0x2, &unk8c->rlen);
		err |= bios_u8(bios, unk8c->offset + 0x3, &unk8c->entriesnum);
		unk8c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER GC6 table version 0x%x\n", unk8c->version);
		return -EINVAL;
	};

	err = 0;
	unk8c->entries = malloc(unk8c->entriesnum * sizeof(struct envy_bios_power_unk8c_entry));
	for (i = 0; i < unk8c->entriesnum; i++) {
		uint32_t data = unk8c->offset + unk8c->hlen + i * unk8c->rlen;

		unk8c->entries[i].offset = data;
	}

	return 0;
}